

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)

{
  int iVar1;
  size_t sVar2;
  LIST_ITEM_HANDLE item_handle;
  void *pvVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar4 = "Invalid argument (handle is NULL";
      iVar1 = 0x659;
LAB_0012d9e2:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",iVar1,1,pcVar4);
      return;
    }
  }
  else {
    sVar2 = get_number_of_registered_devices((AMQP_TRANSPORT_INSTANCE *)handle);
    if (sVar2 == 1) {
      for (item_handle = singlylinkedlist_get_head_item
                                   (*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
          item_handle != (LIST_ITEM_HANDLE)0x0;
          item_handle = singlylinkedlist_get_next_item(item_handle)) {
        pvVar3 = singlylinkedlist_item_get_value(item_handle);
        if (pvVar3 == (void *)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            return;
          }
          pcVar4 = "Failed retrieving registered device information";
          iVar1 = 0x66d;
          goto LAB_0012d9e2;
        }
        iVar1 = amqp_device_unsubscribe_for_twin_updates(*(AMQP_DEVICE_HANDLE *)((long)pvVar3 + 8));
        if (iVar1 != 0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            return;
          }
          pcVar4 = "Failed unsubscribing for device Twin updates";
          iVar1 = 0x672;
          goto LAB_0012d9e2;
        }
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar4 = "Device Twin not supported on device multiplexing scenario";
        iVar1 = 0x661;
        goto LAB_0012d9e2;
      }
    }
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("Invalid argument (handle is NULL");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport = (AMQP_TRANSPORT_INSTANCE*)handle;

        if (get_number_of_registered_devices(transport) != 1)
        {
            LogError("Device Twin not supported on device multiplexing scenario");
        }
        else
        {
            LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(transport->registered_devices);

            while (list_item != NULL)
            {
                AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                {
                    LogError("Failed retrieving registered device information");
                    break;
                }
                else if (amqp_device_unsubscribe_for_twin_updates(registered_device->device_handle) != RESULT_OK)
                {
                    LogError("Failed unsubscribing for device Twin updates");
                    break;
                }

                list_item = singlylinkedlist_get_next_item(list_item);
            }
        }
    }
}